

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

back_insert_iterator<fmt::v7::detail::buffer<char>_> __thiscall
fmt::v7::detail::write_bytes<char,std::back_insert_iterator<fmt::v7::detail::buffer<char>>>
          (detail *this,back_insert_iterator<fmt::v7::detail::buffer<char>_> out,string_view bytes,
          basic_format_specs<char> *specs)

{
  back_insert_iterator<fmt::v7::detail::buffer<char>_> bVar1;
  anon_class_16_1_a7b7af8b local_10;
  
  local_10.bytes.size_ = (size_t)bytes.data_;
  local_10.bytes.data_ = (char *)out.container;
  bVar1 = write_padded<(fmt::v7::align::type)1,std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char,fmt::v7::detail::write_bytes<char,std::back_insert_iterator<fmt::v7::detail::buffer<char>>>(std::back_insert_iterator<fmt::v7::detail::buffer<char>>,fmt::v7::basic_string_view<char>,fmt::v7::basic_format_specs<char>const&)::_lambda(std::back_insert_iterator<fmt::v7::detail::buffer<char>>)_1_>
                    ((back_insert_iterator<fmt::v7::detail::buffer<char>_>)this,
                     (basic_format_specs<char> *)bytes.size_,local_10.bytes.size_,&local_10);
  return (back_insert_iterator<fmt::v7::detail::buffer<char>_>)bVar1.container;
}

Assistant:

OutputIt write_bytes(OutputIt out, string_view bytes,
                     const basic_format_specs<Char>& specs) {
  using iterator = remove_reference_t<decltype(reserve(out, 0))>;
  return write_padded(out, specs, bytes.size(), [bytes](iterator it) {
    const char* data = bytes.data();
    return copy_str<Char>(data, data + bytes.size(), it);
  });
}